

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ClassFinalize(void)

{
  SystemToolsTranslationMap *pSVar1;
  
  pSVar1 = TranslationMap;
  if (TranslationMap != (SystemToolsTranslationMap *)0x0) {
    SystemToolsTranslationMap::~SystemToolsTranslationMap(TranslationMap);
    operator_delete(pSVar1,0x30);
  }
  return;
}

Assistant:

void SystemTools::ClassFinalize()
{
  delete SystemTools::TranslationMap;
#ifdef _WIN32
  delete SystemTools::PathCaseMap;
  delete SystemTools::EnvMap;
#endif
#ifdef __CYGWIN__
  delete SystemTools::Cyg2Win32Map;
#endif
}